

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O0

void __thiscall VGMPlayer::InitDevices(VGMPlayer *this)

{
  byte deviceID;
  byte chipID_00;
  UINT8 UVar1;
  DEV_SMPL *pDVar2;
  UINT16 UVar3;
  UINT32 UVar4;
  size_type sVar5;
  VGMPlayer *pVVar6;
  CHIP_DEVICE *pCVar7;
  _func_int **pp_Var8;
  char *pcVar9;
  size_t sVar10;
  reference pvVar11;
  PLR_DEV_OPTS *local_250;
  UINT32 local_214;
  PLR_DEV_OPTS *local_210;
  UINT8 local_1f1;
  UINT8 resmplMode;
  UINT16 chipVol;
  reference pvStack_1f0;
  UINT8 linkCntr;
  VGM_BASEDEV *clDev_1;
  PLR_DEV_OPTS *devOpts_1;
  DEV_INFO *devInf_1;
  CHIP_DEVICE *chipDev_1;
  size_t optID;
  VGM_BASEDEV *clDev;
  DEVLINK_CB_DATA dlCbData;
  char postFix [16];
  allocator local_179;
  undefined1 local_178 [8];
  string devName;
  UINT32 hdrClock;
  SN76496_CFG *snCfg;
  CHIP_DEVICE *otherDev;
  UINT8 retVal;
  PLR_DEV_OPTS *devOpts;
  DEV_INFO *devInf;
  CHIP_DEVICE chipDev;
  DEV_GEN_CFG *devCfg;
  UINT8 chipID_1;
  UINT8 chipType;
  SONG_DEV_CFG *sdCfg;
  UINT8 chipID;
  ulong uStack_18;
  UINT8 vgmChip;
  size_t curChip;
  VGMPlayer *this_local;
  
  memset(this->_shownCmdWarnings,0,0x100);
  std::vector<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>::clear
            (&this->_devices);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->_devNames);
  for (sdCfg._7_1_ = 0; sdCfg._7_1_ < 0x2a; sdCfg._7_1_ = sdCfg._7_1_ + 1) {
    for (sdCfg._6_1_ = 0; sdCfg._6_1_ < 2; sdCfg._6_1_ = sdCfg._6_1_ + 1) {
      this->_vdDevMap[sdCfg._7_1_][sdCfg._6_1_] = 0xffffffffffffffff;
    }
  }
  for (uStack_18 = 0; uStack_18 < 0x54; uStack_18 = uStack_18 + 1) {
    this->_optDevMap[uStack_18] = 0xffffffffffffffff;
  }
  if ((this->_p2612Fix & 0x80) == 0) {
    this->_p2612Fix = this->_p2612Fix & 0xfe;
  }
  else {
    this->_p2612Fix = this->_p2612Fix | 1;
  }
  for (uStack_18 = 0;
      sVar5 = std::vector<VGMPlayer::SONG_DEV_CFG,_std::allocator<VGMPlayer::SONG_DEV_CFG>_>::size
                        (&this->_devCfgs), uStack_18 < sVar5; uStack_18 = uStack_18 + 1) {
    pVVar6 = (VGMPlayer *)
             std::vector<VGMPlayer::SONG_DEV_CFG,_std::allocator<VGMPlayer::SONG_DEV_CFG>_>::
             operator[](&this->_devCfgs,uStack_18);
    deviceID = *(UINT8 *)((long)&(pVVar6->super_PlayerBase)._outSmplRate + 1);
    chipID_00 = *(UINT8 *)((long)&(pVVar6->super_PlayerBase)._outSmplRate + 2);
    chipDev.logCbData.chipDevID =
         (size_t)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            &(pVVar6->super_PlayerBase)._eventCbFunc,0);
    memset(&devInf,0,0xf0);
    (pVVar6->super_PlayerBase)._vptr_PlayerBase = (_func_int **)0xffffffffffffffff;
    chipDev.base.linkDev._0_1_ = (UINT8)(pVVar6->super_PlayerBase)._outSmplRate;
    chipDev.base.linkDev._1_1_ = *(UINT8 *)((long)&(pVVar6->super_PlayerBase)._outSmplRate + 1);
    chipDev._136_8_ = this->_devOptMap[deviceID][chipID_00];
    chipDev.optID = uStack_18;
    devInf = (DEV_INFO *)0x0;
    chipDev.base.resmpl.smplBufs[1] = (DEV_SMPL *)0x0;
    if (chipDev._136_8_ == 0xffffffffffffffff) {
      local_210 = (PLR_DEV_OPTS *)0x0;
    }
    else {
      local_210 = this->_devOpts + chipDev._136_8_;
    }
    if (local_210 == (PLR_DEV_OPTS *)0x0) {
      local_214 = 0;
    }
    else {
      local_214 = local_210->emuCore[0];
    }
    *(UINT32 *)chipDev.logCbData.chipDevID = local_214;
    if (local_210 == (PLR_DEV_OPTS *)0x0) {
      UVar1 = '\0';
    }
    else {
      UVar1 = local_210->srMode;
    }
    *(UINT8 *)(chipDev.logCbData.chipDevID + 4) = UVar1;
    if ((local_210 == (PLR_DEV_OPTS *)0x0) || (local_210->smplRate == 0)) {
      *(UINT32 *)(chipDev.logCbData.chipDevID + 0xc) = (this->super_PlayerBase)._outSmplRate;
    }
    else {
      *(UINT32 *)(chipDev.logCbData.chipDevID + 0xc) = local_210->smplRate;
    }
    chipDev.base.linkDev._2_1_ = chipID_00;
    switch(deviceID) {
    case 0:
      if ((((chipID_00 & 1) != 0) && (*(char *)(chipDev.logCbData.chipDevID + 5) != '\0')) &&
         (pCVar7 = GetDevicePtr(this,(UINT8)(pVVar6->super_PlayerBase)._outSmplRate,chipID_00 ^ 1),
         pCVar7 != (CHIP_DEVICE *)0x0)) {
        *(DEV_DATA **)(chipDev.logCbData.chipDevID + 0x18) = (pCVar7->base).defInf.dataPtr;
        *(UINT32 *)chipDev.logCbData.chipDevID = ((pCVar7->base).defInf.devDef)->coreID;
      }
      if (*(int *)chipDev.logCbData.chipDevID == 0) {
        *(undefined4 *)chipDev.logCbData.chipDevID = 0x4d414d45;
      }
      otherDev._7_1_ =
           SndEmu_Start(deviceID,(DEV_GEN_CFG *)chipDev.logCbData.chipDevID,(DEV_INFO *)&devInf);
      if (otherDev._7_1_ == '\0') {
        SndEmu_GetDeviceFunc
                  ((DEV_DEF *)chipDev.base.defInf._8_8_,'\0','\x11',0,(void **)&chipDev.cfgID);
      }
      break;
    default:
      if (deviceID == 2) {
        chipDev.base.linkDev._4_4_ =
             *(byte *)(chipDev.logCbData.chipDevID + 5) | chipDev.base.linkDev._4_4_;
      }
      else if (deviceID == 0x80) {
        chipDev.base.linkDev._4_4_ = chipDev.base.linkDev._4_4_ | 1;
      }
      otherDev._7_1_ =
           SndEmu_Start(deviceID,(DEV_GEN_CFG *)chipDev.logCbData.chipDevID,(DEV_INFO *)&devInf);
      if (otherDev._7_1_ == '\0') {
        SndEmu_GetDeviceFunc
                  ((DEV_DEF *)chipDev.base.defInf._8_8_,'\0','\x11',0,(void **)&chipDev.cfgID);
        SndEmu_GetDeviceFunc((DEV_DEF *)chipDev.base.defInf._8_8_,'\0','!',0,&chipDev.write8);
        SndEmu_GetDeviceFunc((DEV_DEF *)chipDev.base.defInf._8_8_,'\x10',0x81,0,&chipDev.writeM16);
        SndEmu_GetDeviceFunc((DEV_DEF *)chipDev.base.defInf._8_8_,'\x10',0x80,0,&chipDev.romSize);
      }
      break;
    case 5:
      if (*(int *)chipDev.logCbData.chipDevID == 0) {
        if (*(char *)(chipDev.logCbData.chipDevID + 5) == '\x01') {
          *(undefined4 *)chipDev.logCbData.chipDevID = 0x47454e53;
        }
        else {
          *(undefined4 *)chipDev.logCbData.chipDevID = 0x4d414d45;
        }
      }
      otherDev._7_1_ =
           SndEmu_Start(deviceID,(DEV_GEN_CFG *)chipDev.logCbData.chipDevID,(DEV_INFO *)&devInf);
      if (otherDev._7_1_ == '\0') {
        SndEmu_GetDeviceFunc
                  ((DEV_DEF *)chipDev.base.defInf._8_8_,'\0','\x11',0,(void **)&chipDev.cfgID);
        SndEmu_GetDeviceFunc((DEV_DEF *)chipDev.base.defInf._8_8_,'\x10','!',0,&chipDev.write8);
        SndEmu_GetDeviceFunc((DEV_DEF *)chipDev.base.defInf._8_8_,'\x10',0x80,0,&chipDev.romSize);
      }
      break;
    case 8:
      otherDev._7_1_ =
           SndEmu_Start(deviceID,(DEV_GEN_CFG *)chipDev.logCbData.chipDevID,(DEV_INFO *)&devInf);
      if (otherDev._7_1_ == '\0') {
        SndEmu_GetDeviceFunc
                  ((DEV_DEF *)chipDev.base.defInf._8_8_,'\0','\x11',0,(void **)&chipDev.cfgID);
        SndEmu_GetDeviceFunc
                  ((DEV_DEF *)chipDev.base.defInf._8_8_,'\x10',0x81,0x41,&chipDev.writeM16);
        SndEmu_GetDeviceFunc((DEV_DEF *)chipDev.base.defInf._8_8_,'\x10',0x80,0x41,&chipDev.romSize)
        ;
        SndEmu_GetDeviceFunc
                  ((DEV_DEF *)chipDev.base.defInf._8_8_,'\x10',0x81,0x42,&chipDev.romWrite);
        SndEmu_GetDeviceFunc
                  ((DEV_DEF *)chipDev.base.defInf._8_8_,'\x10',0x80,0x42,&chipDev.romSizeB);
      }
      break;
    case 0xd:
      otherDev._7_1_ =
           SndEmu_Start(deviceID,(DEV_GEN_CFG *)chipDev.logCbData.chipDevID,(DEV_INFO *)&devInf);
      if (otherDev._7_1_ == '\0') {
        SndEmu_GetDeviceFunc
                  ((DEV_DEF *)chipDev.base.defInf._8_8_,'\0','\x11',0,(void **)&chipDev.cfgID);
        SndEmu_GetDeviceFunc
                  ((DEV_DEF *)chipDev.base.defInf._8_8_,'\x10',0x81,0x524f,&chipDev.writeM16);
        SndEmu_GetDeviceFunc
                  ((DEV_DEF *)chipDev.base.defInf._8_8_,'\x10',0x80,0x524f,&chipDev.romSize);
        SndEmu_GetDeviceFunc
                  ((DEV_DEF *)chipDev.base.defInf._8_8_,'\x10',0x81,0x5241,&chipDev.romWrite);
        SndEmu_GetDeviceFunc
                  ((DEV_DEF *)chipDev.base.defInf._8_8_,'\x10',0x80,0x5241,&chipDev.romSizeB);
        LoadOPL4ROM(this,(CHIP_DEVICE *)&devInf);
      }
      break;
    case 0x11:
      otherDev._7_1_ =
           SndEmu_Start(deviceID,(DEV_GEN_CFG *)chipDev.logCbData.chipDevID,(DEV_INFO *)&devInf);
      if (otherDev._7_1_ == '\0') {
        SndEmu_GetDeviceFunc((DEV_DEF *)chipDev.base.defInf._8_8_,'\0','\x12',0,&chipDev.writeM8);
      }
      break;
    case 0x15:
      otherDev._7_1_ =
           SndEmu_Start(deviceID,(DEV_GEN_CFG *)chipDev.logCbData.chipDevID,(DEV_INFO *)&devInf);
      if (otherDev._7_1_ == '\0') {
        SndEmu_GetDeviceFunc
                  ((DEV_DEF *)chipDev.base.defInf._8_8_,'\0','\x11',0,(void **)&chipDev.cfgID);
        SndEmu_GetDeviceFunc((DEV_DEF *)chipDev.base.defInf._8_8_,'\0','\x12',0,&chipDev.writeM8);
        SndEmu_GetDeviceFunc((DEV_DEF *)chipDev.base.defInf._8_8_,'\x10',0x81,0,&chipDev.writeM16);
        SndEmu_GetDeviceFunc((DEV_DEF *)chipDev.base.defInf._8_8_,'\x10',0x80,0,&chipDev.romSize);
      }
      break;
    case 0x1f:
      chipDev.base.linkDev._4_4_ = 0;
      UVar4 = GetChipClock(this,(UINT8)(pVVar6->super_PlayerBase)._outSmplRate,chipID_00);
      devName.field_2._12_4_ = UVar4 & 0x3fffffff;
      if ((uint)devName.field_2._12_4_ < *(uint *)(chipDev.logCbData.chipDevID + 8)) {
        chipDev.base.linkDev._4_4_ = chipDev.base.linkDev._4_4_ | 1;
      }
      if (*(int *)chipDev.logCbData.chipDevID == 0) {
        *(undefined4 *)chipDev.logCbData.chipDevID = 0x43545200;
      }
      otherDev._7_1_ =
           SndEmu_Start(deviceID,(DEV_GEN_CFG *)chipDev.logCbData.chipDevID,(DEV_INFO *)&devInf);
      if (otherDev._7_1_ == '\0') {
        SndEmu_GetDeviceFunc
                  ((DEV_DEF *)chipDev.base.defInf._8_8_,'\0','\x11',0,(void **)&chipDev.cfgID);
        SndEmu_GetDeviceFunc((DEV_DEF *)chipDev.base.defInf._8_8_,'\x02','\x12',0,&chipDev.writeM8);
        SndEmu_GetDeviceFunc((DEV_DEF *)chipDev.base.defInf._8_8_,'\x10',0x81,0,&chipDev.writeM16);
        SndEmu_GetDeviceFunc((DEV_DEF *)chipDev.base.defInf._8_8_,'\x10',0x80,0,&chipDev.romSize);
        memset(this->_qsWork + chipID_00,0,0x48);
        if (*(int *)(chipDev.base.defInf._8_8_ + 0x10) == 0x4d414d45) {
          chipDev.base.linkDev._4_4_ = chipDev.base.linkDev._4_4_ & 0xfffffffe;
        }
        if (chipDev.writeM8 == (DEVFUNC_WRITE_A16D8)0x0) {
          if (chipDev.cfgID == 0) {
            this->_qsWork[chipID_00].write = (_func_void_CHIP_DEVICE_ptr_UINT8_UINT16 *)0x0;
          }
          else {
            this->_qsWork[chipID_00].write = WriteQSound_B;
          }
        }
        else {
          this->_qsWork[chipID_00].write = WriteQSound_A;
        }
      }
      break;
    case 0x20:
      otherDev._7_1_ =
           SndEmu_Start(deviceID,(DEV_GEN_CFG *)chipDev.logCbData.chipDevID,(DEV_INFO *)&devInf);
      if (otherDev._7_1_ == '\0') {
        SndEmu_GetDeviceFunc((DEV_DEF *)chipDev.base.defInf._8_8_,'\0','!',0,&chipDev.write8);
        SndEmu_GetDeviceFunc((DEV_DEF *)chipDev.base.defInf._8_8_,'\0','\"',0,&chipDev.writeD16);
        SndEmu_GetDeviceFunc((DEV_DEF *)chipDev.base.defInf._8_8_,'\x10',0x80,0,&chipDev.romSize);
      }
      break;
    case 0x21:
      otherDev._7_1_ =
           SndEmu_Start(deviceID,(DEV_GEN_CFG *)chipDev.logCbData.chipDevID,(DEV_INFO *)&devInf);
      if (otherDev._7_1_ == '\0') {
        SndEmu_GetDeviceFunc
                  ((DEV_DEF *)chipDev.base.defInf._8_8_,'\0','\x11',0,(void **)&chipDev.cfgID);
        SndEmu_GetDeviceFunc((DEV_DEF *)chipDev.base.defInf._8_8_,'\x10','!',0,&chipDev.write8);
      }
      break;
    case 0x25:
      otherDev._7_1_ =
           SndEmu_Start(deviceID,(DEV_GEN_CFG *)chipDev.logCbData.chipDevID,(DEV_INFO *)&devInf);
      if (otherDev._7_1_ == '\0') {
        SndEmu_GetDeviceFunc
                  ((DEV_DEF *)chipDev.base.defInf._8_8_,'\0','\x11',0,(void **)&chipDev.cfgID);
        SndEmu_GetDeviceFunc((DEV_DEF *)chipDev.base.defInf._8_8_,'\0','\x12',0,&chipDev.writeM8);
        SndEmu_GetDeviceFunc((DEV_DEF *)chipDev.base.defInf._8_8_,'\x10',0x80,0,&chipDev.romSize);
      }
      break;
    case 0x27:
      otherDev._7_1_ =
           SndEmu_Start(deviceID,(DEV_GEN_CFG *)chipDev.logCbData.chipDevID,(DEV_INFO *)&devInf);
      if (otherDev._7_1_ == '\0') {
        SndEmu_GetDeviceFunc((DEV_DEF *)chipDev.base.defInf._8_8_,'\0','\"',0,&chipDev.writeD16);
        SndEmu_GetDeviceFunc((DEV_DEF *)chipDev.base.defInf._8_8_,'\x10',0x81,0,&chipDev.writeM16);
        SndEmu_GetDeviceFunc((DEV_DEF *)chipDev.base.defInf._8_8_,'\x10',0x80,0,&chipDev.romSize);
      }
    }
    if (otherDev._7_1_ == '\0') {
      pp_Var8 = (_func_int **)
                std::vector<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>::size
                          (&this->_devices);
      (pVVar6->super_PlayerBase)._vptr_PlayerBase = pp_Var8;
      pcVar9 = SndEmu_GetDevName(deviceID,'\0',(DEV_GEN_CFG *)chipDev.logCbData.chipDevID);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_178,pcVar9,&local_179);
      std::allocator<char>::~allocator((allocator<char> *)&local_179);
      UVar4 = GetChipCount(this,(UINT8)(pVVar6->super_PlayerBase)._outSmplRate);
      if (1 < UVar4) {
        snprintf((char *)&dlCbData.chipDev,0x10," #%u",(ulong)(chipID_00 + 1));
        std::__cxx11::string::operator+=((string *)local_178,(char *)&dlCbData.chipDev);
      }
      chipDev.romWriteB = (DEVFUNC_WRITE_BLOCK)this;
      chipDev.logCbData.player =
           (VGMPlayer *)
           std::vector<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>::size
                     (&this->_devices);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->_devNames,(value_type *)local_178);
      dlCbData.sdCfg = (SONG_DEV_CFG *)&devInf;
      clDev = (VGM_BASEDEV *)this;
      dlCbData.player = pVVar6;
      if (*(long *)(chipDev.base.defInf._8_8_ + 0x58) != 0) {
        (**(code **)(chipDev.base.defInf._8_8_ + 0x58))(devInf,SndEmuLogCB,&chipDev.romWriteB);
      }
      SetupLinkedDevices((VGM_BASEDEV *)&devInf,DeviceLinkCallback,&clDev);
      if (local_210 != (PLR_DEV_OPTS *)0x0) {
        RefreshDevOptions(this,(CHIP_DEVICE *)&devInf,local_210);
        RefreshMuting(this,(CHIP_DEVICE *)&devInf,&local_210->muteOpts);
        RefreshPanning(this,(CHIP_DEVICE *)&devInf,&local_210->panOpts);
      }
      pDVar2 = chipDev.base.resmpl.smplBufs[1];
      if ((((int)chipDev.base.defInf.devDef != 0) && (*(char *)chipDev.base.defInf._24_8_ == '\x12')
          ) && ((sVar10 = DeviceID2OptionID(this,(uint)chipID_00 << 0x10 | 0x80000012),
                sVar10 != 0xffffffffffffffff &&
                ((pDVar2 != (DEV_SMPL *)0x0 && (*(long *)(*(long *)(pDVar2 + 4) + 0x38) != 0)))))) {
        (**(code **)(*(long *)(pDVar2 + 4) + 0x38))(devInf,this->_devOpts[sVar10].coreOpts);
      }
      sVar5 = std::vector<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>::size
                        (&this->_devices);
      this->_vdDevMap[(byte)(pVVar6->super_PlayerBase)._outSmplRate][chipID_00] = sVar5;
      if (chipDev._136_8_ != -1) {
        sVar5 = std::vector<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>::size
                          (&this->_devices);
        this->_optDevMap[chipDev._136_8_] = sVar5;
      }
      std::vector<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>::push_back
                (&this->_devices,(value_type *)&devInf);
      std::__cxx11::string::~string((string *)local_178);
    }
    else {
      devInf = (DEV_INFO *)0x0;
      chipDev.base.defInf.sampleRate = 0;
      chipDev.base.defInf._12_4_ = 0;
    }
  }
  for (uStack_18 = 0;
      sVar5 = std::vector<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>::size
                        (&this->_devices), uStack_18 < sVar5; uStack_18 = uStack_18 + 1) {
    pvVar11 = std::vector<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>::
              operator[](&this->_devices,uStack_18);
    if (pvVar11->optID == 0xffffffffffffffff) {
      local_250 = (PLR_DEV_OPTS *)0x0;
    }
    else {
      local_250 = this->_devOpts + pvVar11->optID;
    }
    if (((pvVar11->base).defInf.devDef)->SetLogCB != (DEVFUNC_SETLOGCB)0x0) {
      (*((pvVar11->base).defInf.devDef)->SetLogCB)
                ((pvVar11->base).defInf.dataPtr,SndEmuLogCB,&pvVar11->logCbData);
    }
    local_1f1 = '\0';
    for (pvStack_1f0 = pvVar11; pvStack_1f0 != (reference)0x0;
        pvStack_1f0 = (reference)(pvStack_1f0->base).linkDev) {
      UVar3 = GetChipVolume(this,pvVar11->vgmChipType,pvVar11->chipID,local_1f1);
      if (local_250 == (PLR_DEV_OPTS *)0x0) {
        UVar1 = '\0';
      }
      else {
        UVar1 = local_250->resmplMode;
      }
      Resmpl_SetVals(&(pvStack_1f0->base).resmpl,UVar1,UVar3,(this->super_PlayerBase)._outSmplRate);
      Resmpl_DevConnect(&(pvStack_1f0->base).resmpl,(DEV_INFO *)pvStack_1f0);
      Resmpl_Init(&(pvStack_1f0->base).resmpl);
      local_1f1 = local_1f1 + '\x01';
    }
    if ((pvVar11->chipType == '\t') &&
       (UVar4 = GetChipClock(this,pvVar11->vgmChipType,pvVar11->chipID), pvStack_1f0 = pvVar11,
       (UVar4 & 0x80000000) != 0)) {
      for (; pvStack_1f0 != (reference)0x0; pvStack_1f0 = (reference)(pvStack_1f0->base).linkDev) {
        if ((pvVar11->chipID & 1) == 0) {
          (pvStack_1f0->base).resmpl.volumeL = (pvStack_1f0->base).resmpl.volumeL << 1;
          (pvStack_1f0->base).resmpl.volumeR = 0;
        }
        else {
          (pvStack_1f0->base).resmpl.volumeL = 0;
          (pvStack_1f0->base).resmpl.volumeR = (pvStack_1f0->base).resmpl.volumeR << 1;
        }
      }
    }
  }
  UVar3 = EstimateOverallVolume(this);
  NormalizeOverallVolume(this,UVar3);
  return;
}

Assistant:

void VGMPlayer::InitDevices(void)
{
	size_t curChip;
	
	memset(_shownCmdWarnings, 0, 0x100);
	
	_devices.clear();
	_devNames.clear();
	{
		UINT8 vgmChip;
		UINT8 chipID;
		for (vgmChip = 0x00; vgmChip < _CHIP_COUNT; vgmChip ++)
		{
			for (chipID = 0; chipID < 2; chipID ++)
				_vdDevMap[vgmChip][chipID] = (size_t)-1;
		}
	}
	for (curChip = 0; curChip < _OPT_DEV_COUNT * 2; curChip ++)
		_optDevMap[curChip] = (size_t)-1;
	
	// When the Project2612 fix is enabled [bit 7], enable it during chip init [bit 0].
	if (_p2612Fix & P2612FIX_ENABLE)
		_p2612Fix |= P2612FIX_ACTIVE;
	else
		_p2612Fix &= ~P2612FIX_ACTIVE;
	
	for (curChip = 0; curChip < _devCfgs.size(); curChip ++)
	{
		SONG_DEV_CFG& sdCfg = _devCfgs[curChip];
		UINT8 chipType = sdCfg.type;
		UINT8 chipID = sdCfg.instance;
		DEV_GEN_CFG* devCfg = (DEV_GEN_CFG*)&sdCfg.cfgData[0];
		CHIP_DEVICE chipDev;
		DEV_INFO* devInf;
		const PLR_DEV_OPTS* devOpts;
		UINT8 retVal;
		
		memset(&chipDev, 0x00, sizeof(CHIP_DEVICE));
		devInf = &chipDev.base.defInf;
		
		sdCfg.deviceID = (size_t)-1;
		chipDev.vgmChipType = sdCfg.vgmChipType;
		chipDev.chipType = sdCfg.type;
		chipDev.chipID = chipID;
		chipDev.optID = _devOptMap[chipType][chipID];
		chipDev.cfgID = curChip;
		chipDev.base.defInf.dataPtr = NULL;
		chipDev.base.linkDev = NULL;
		
		devOpts = (chipDev.optID != (size_t)-1) ? &_devOpts[chipDev.optID] : NULL;
		devCfg->emuCore = (devOpts != NULL) ? devOpts->emuCore[0] : 0x00;
		devCfg->srMode = (devOpts != NULL) ? devOpts->srMode : DEVRI_SRMODE_NATIVE;
		if (devOpts != NULL && devOpts->smplRate)
			devCfg->smplRate = devOpts->smplRate;
		else
			devCfg->smplRate = _outSmplRate;
		
		switch(chipType)
		{
		case DEVID_SN76496:
			if ((chipID & 0x01) && devCfg->flags)	// must be 2nd chip + T6W28 mode
			{
				CHIP_DEVICE* otherDev = GetDevicePtr(sdCfg.vgmChipType, chipID ^ 0x01);
				if (otherDev != NULL)
				{
					SN76496_CFG* snCfg = (SN76496_CFG*)devCfg;
					// set pointer to other instance, for connecting both
					snCfg->t6w28_tone = otherDev->base.defInf.dataPtr;
					// ensure that both instances use the same core, as they are going to cross-reference each other
					snCfg->_genCfg.emuCore = otherDev->base.defInf.devDef->coreID;
				}
			}
			
			if (! devCfg->emuCore)
				devCfg->emuCore = FCC_MAME;
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			break;
		case DEVID_RF5C68:
			if (! devCfg->emuCore)
			{
				if (devCfg->flags == 1)	// RF5C164
					devCfg->emuCore = FCC_GENS;
				else //if (devCfg->flags == 0)	// RF5C68
					devCfg->emuCore = FCC_MAME;
			}
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_A16D8, 0, (void**)&chipDev.writeM8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0, (void**)&chipDev.romWrite);
			break;
		case DEVID_YM2610:
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_MEMSIZE, 'A', (void**)&chipDev.romSize);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 'A', (void**)&chipDev.romWrite);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_MEMSIZE, 'B', (void**)&chipDev.romSizeB);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 'B', (void**)&chipDev.romWriteB);
			break;
		case DEVID_YMF278B:
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_MEMSIZE, 0x524F, (void**)&chipDev.romSize);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0x524F, (void**)&chipDev.romWrite);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_MEMSIZE, 0x5241, (void**)&chipDev.romSizeB);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0x5241, (void**)&chipDev.romWriteB);
			LoadOPL4ROM(&chipDev);
			break;
		case DEVID_32X_PWM:
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D16, 0, (void**)&chipDev.writeD16);
			break;
		case DEVID_YMW258:
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D16, 0, (void**)&chipDev.writeD16);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_MEMSIZE, 0, (void**)&chipDev.romSize);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0, (void**)&chipDev.romWrite);
			break;
		case DEVID_C352:
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A16D16, 0, (void**)&chipDev.writeM16);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_MEMSIZE, 0, (void**)&chipDev.romSize);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0, (void**)&chipDev.romWrite);
			break;
		case DEVID_QSOUND:
			chipDev.flags = 0x00;
			{
				UINT32 hdrClock = GetChipClock(sdCfg.vgmChipType, chipID) & ~0xC0000000;
				if (hdrClock < devCfg->clock)	// QSound VGMs with old (4 MHz) clock
					chipDev.flags |= 0x01;	// enable QSound hacks (required for proper playback of old VGMs)
			}
			if (! devCfg->emuCore)
				devCfg->emuCore = FCC_CTR_;
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_QUICKWRITE, DEVRW_A8D16, 0, (void**)&chipDev.writeD16);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_MEMSIZE, 0, (void**)&chipDev.romSize);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0, (void**)&chipDev.romWrite);
			
			memset(&_qsWork[chipID], 0x00, sizeof(QSOUND_WORK));
			if (devInf->devDef->coreID == FCC_MAME)
				chipDev.flags &= ~0x01;	// MAME's old HLE doesn't need those hacks
			if (chipDev.writeD16 != NULL)
				_qsWork[chipID].write = &VGMPlayer::WriteQSound_A;
			else if (chipDev.write8 != NULL)
				_qsWork[chipID].write = &VGMPlayer::WriteQSound_B;
			else
				_qsWork[chipID].write = NULL;
			break;
		case DEVID_WSWAN:
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_A16D8, 0, (void**)&chipDev.writeM8);
			break;
		case DEVID_ES5506:
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D16, 0, (void**)&chipDev.writeD16);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0, (void**)&chipDev.romWrite);
			break;
		case DEVID_SCSP:
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A16D8, 0, (void**)&chipDev.writeM8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A16D16, 0, (void**)&chipDev.writeM16);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0, (void**)&chipDev.romWrite);
			break;
		default:
			if (chipType == DEVID_YM2612)
				chipDev.flags |= devCfg->flags;
			else if (chipType == DEVID_C219)
				chipDev.flags |= 0x01;	// enable 16-bit byteswap patch on all ROM data
			
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A16D8, 0, (void**)&chipDev.writeM8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_MEMSIZE, 0, (void**)&chipDev.romSize);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0, (void**)&chipDev.romWrite);
			break;
		}
		if (retVal)
		{
			devInf->dataPtr = NULL;
			devInf->devDef = NULL;
			continue;
		}
		sdCfg.deviceID = _devices.size();
		
		std::string devName = SndEmu_GetDevName(chipType, 0x00, devCfg);	// use short name for now
		if (GetChipCount(sdCfg.vgmChipType) > 1)
		{
			char postFix[0x10];
			snprintf(postFix, 0x10, " #%u", 1 + chipID);
			devName += postFix;
		}
		chipDev.logCbData.player = this;
		chipDev.logCbData.chipDevID = _devices.size();
		_devNames.push_back(devName);	// push here, so that we can have logs during SetupLinkedDevices()
		
		{
			DEVLINK_CB_DATA dlCbData;
			dlCbData.player = this;
			dlCbData.sdCfg = &sdCfg;
			dlCbData.chipDev = &chipDev;
			if (devInf->devDef->SetLogCB != NULL)	// allow for device link warnings
				devInf->devDef->SetLogCB(devInf->dataPtr, VGMPlayer::SndEmuLogCB, &chipDev.logCbData);
			SetupLinkedDevices(&chipDev.base, &DeviceLinkCallback, &dlCbData);
		}
		// already done by SndEmu_Start()
		//devInf->devDef->Reset(devInf->dataPtr);
		
		if (devOpts != NULL)
		{
			RefreshDevOptions(chipDev, *devOpts);
			RefreshMuting(chipDev, devOpts->muteOpts);
			RefreshPanning(chipDev, devOpts->panOpts);
		}
		if (devInf->linkDevCount > 0 && devInf->linkDevs[0].devID == DEVID_AY8910)
		{
			VGM_BASEDEV* clDev = chipDev.base.linkDev;
			size_t optID = DeviceID2OptionID(PLR_DEV_ID(DEVID_AY8910, chipID));
			if (optID != (size_t)-1 && clDev != NULL && clDev->defInf.devDef->SetOptionBits != NULL)
				clDev->defInf.devDef->SetOptionBits(devInf->dataPtr, _devOpts[optID].coreOpts);
		}

		_vdDevMap[sdCfg.vgmChipType][chipID] = _devices.size();
		if (chipDev.optID != (size_t)-1)
			_optDevMap[chipDev.optID] = _devices.size();
		_devices.push_back(chipDev);
	}	// end for (curChip)
	
	// Initializing the resampler has to be done separately due to reallocations happening above
	// and the memory address of the RESMPL_STATE mustn't change in order to allow callbacks from the devices.
	for (curChip = 0; curChip < _devices.size(); curChip ++)
	{
		CHIP_DEVICE& chipDev = _devices[curChip];
		DEV_INFO* devInf = &chipDev.base.defInf;
		const PLR_DEV_OPTS* devOpts = (chipDev.optID != (size_t)-1) ? &_devOpts[chipDev.optID] : NULL;
		VGM_BASEDEV* clDev;
		
		if (devInf->devDef->SetLogCB != NULL)
			devInf->devDef->SetLogCB(devInf->dataPtr, VGMPlayer::SndEmuLogCB, &chipDev.logCbData);
		
		UINT8 linkCntr = 0;
		for (clDev = &chipDev.base; clDev != NULL; clDev = clDev->linkDev, linkCntr ++)
		{
			UINT16 chipVol = GetChipVolume(chipDev.vgmChipType, chipDev.chipID, linkCntr);
			UINT8 resmplMode = (devOpts != NULL) ? devOpts->resmplMode : RSMODE_LINEAR;
			
			Resmpl_SetVals(&clDev->resmpl, resmplMode, chipVol, _outSmplRate);
			Resmpl_DevConnect(&clDev->resmpl, &clDev->defInf);
			Resmpl_Init(&clDev->resmpl);
		}
		
		if (chipDev.chipType == DEVID_YM3812)
		{
			if (GetChipClock(chipDev.vgmChipType, chipDev.chipID) & 0x80000000)
			{
				// Dual-OPL with Stereo - 1st chip is panned to the left, 2nd chip is panned to the right
				for (clDev = &chipDev.base; clDev != NULL; clDev = clDev->linkDev, linkCntr ++)
				{
					if (chipDev.chipID & 0x01)
					{
						clDev->resmpl.volumeL = 0x00;
						clDev->resmpl.volumeR *= 2;
					}
					else
					{
						clDev->resmpl.volumeL *= 2;
						clDev->resmpl.volumeR = 0x00;
					}
				}
			}
		}
	}
	
	NormalizeOverallVolume(EstimateOverallVolume());
	
	return;
}